

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O1

void __thiscall
llm_graph_input_attn_kv_unified::set_input
          (llm_graph_input_attn_kv_unified *this,llama_ubatch *ubatch)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ggml_tensor *pgVar4;
  llama_seq_id **pplVar5;
  llama_pos *plVar6;
  llama_kv_cache_unified *plVar7;
  pointer plVar8;
  llama_hparams *plVar9;
  llama_cparams *plVar10;
  _Base_ptr p_Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  char cVar15;
  int iVar16;
  int iVar17;
  _Rb_tree_header *p_Var18;
  ulong uVar19;
  char *pcVar20;
  _Base_ptr p_Var21;
  ulong uVar22;
  ulong uVar23;
  pointer plVar24;
  void *pvVar25;
  undefined8 uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  void *pvVar30;
  _Rb_tree_header *p_Var31;
  int iVar33;
  undefined1 auVar32 [16];
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  ulong local_80;
  long lVar38;
  
  pgVar4 = this->self_kq_mask;
  if (this->self_kq_mask_swa != (ggml_tensor *)0x0 || pgVar4 != (ggml_tensor *)0x0) {
    uVar19 = (ulong)this->kv_self->n;
    uVar1 = ubatch->n_tokens;
    uVar22 = (ulong)ubatch->n_seq_tokens;
    uVar2 = ubatch->n_seqs;
    if (pgVar4 == (ggml_tensor *)0x0) {
      pvVar30 = (void *)0x0;
    }
    else {
      cVar15 = ggml_backend_buffer_is_host(pgVar4->buffer);
      if (cVar15 == '\0') {
        pcVar20 = "ggml_backend_buffer_is_host(self_kq_mask->buffer)";
        uVar26 = 0x1ae;
        goto LAB_001aa5c9;
      }
      pvVar30 = this->self_kq_mask->data;
    }
    if (this->self_kq_mask_swa == (ggml_tensor *)0x0) {
      pvVar25 = (void *)0x0;
    }
    else {
      cVar15 = ggml_backend_buffer_is_host(this->self_kq_mask_swa->buffer);
      if (cVar15 == '\0') {
        pcVar20 = "ggml_backend_buffer_is_host(self_kq_mask_swa->buffer)";
        uVar26 = 0x1b3;
LAB_001aa5c9:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                   ,uVar26,"GGML_ASSERT(%s) failed",pcVar20);
      }
      pvVar25 = this->self_kq_mask_swa->data;
    }
    if ((ulong)uVar2 != 0) {
      pplVar5 = ubatch->seq_id;
      local_80 = 0;
      do {
        if (uVar22 != 0) {
          iVar33 = *pplVar5[local_80];
          plVar6 = ubatch->pos;
          plVar7 = this->kv_self;
          uVar23 = 0;
          do {
            if (uVar19 != 0) {
              uVar3 = plVar6[local_80 * uVar22 + uVar23];
              plVar8 = (plVar7->cells).
                       super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>._M_impl.
                       super__Vector_impl_data._M_start;
              plVar9 = this->hparams;
              plVar10 = this->cparams;
              lVar29 = (uVar23 + local_80 * uVar22) * uVar19;
              uVar28 = 0;
              do {
                p_Var18 = (_Rb_tree_header *)((long)&plVar8[uVar28].seq_id._M_t._M_impl + 8);
                p_Var21 = (_Base_ptr)p_Var18;
                for (p_Var11 = *(_Base_ptr *)((long)&plVar8[uVar28].seq_id._M_t._M_impl + 0x10);
                    (_Rb_tree_header *)p_Var11 != (_Rb_tree_header *)0x0;
                    p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < iVar33]) {
                  if (iVar33 <= (int)*(size_t *)(p_Var11 + 1)) {
                    p_Var21 = p_Var11;
                  }
                }
                p_Var31 = p_Var18;
                if (((_Rb_tree_header *)p_Var21 != p_Var18) &&
                   (p_Var31 = (_Rb_tree_header *)p_Var21,
                   iVar33 < (int)((_Rb_tree_header *)p_Var21)->_M_node_count)) {
                  p_Var31 = p_Var18;
                }
                plVar24 = plVar8 + uVar28;
                fVar34 = -INFINITY;
                if ((p_Var31 != p_Var18) &&
                   (((plVar10->causal_attn != true ||
                     (fVar34 = -INFINITY, plVar24->pos <= (int)uVar3)) &&
                    (fVar34 = 0.0, plVar9->use_alibi == true)))) {
                  iVar16 = plVar24->pos - uVar3;
                  iVar17 = -iVar16;
                  if (iVar16 < 1) {
                    iVar17 = iVar16;
                  }
                  fVar34 = (float)iVar17;
                }
                if (pvVar30 != (void *)0x0) {
                  *(float *)((long)pvVar30 + (uVar28 + lVar29) * 4) = fVar34;
                }
                if (pvVar25 != (void *)0x0) {
                  if (plVar9->n_attn_chunk == 0) {
                    if ((int)plVar9->n_swa <= (int)(uVar3 - plVar24->pos)) {
                      fVar34 = -INFINITY;
                    }
                  }
                  else {
                    iVar17 = uVar3 - uVar3 % plVar9->n_attn_chunk;
                    fVar35 = -INFINITY;
                    if (iVar17 <= (int)uVar3) {
                      fVar35 = fVar34;
                    }
                    fVar34 = -INFINITY;
                    if (iVar17 <= plVar24->pos) {
                      fVar34 = fVar35;
                    }
                  }
                  *(float *)((long)pvVar25 + (uVar28 + lVar29) * 4) = fVar34;
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar19);
            }
            uVar23 = uVar23 + 1;
          } while (uVar23 != uVar22);
        }
        local_80 = local_80 + 1;
      } while (local_80 != uVar2);
    }
    auVar14 = _DAT_002360d0;
    auVar13 = _DAT_002360c0;
    auVar12 = _DAT_002360b0;
    if (pvVar30 != (void *)0x0) {
      lVar29 = (long)(int)uVar1;
      uVar22 = (ulong)uVar1 + 0x3f & 0x1ffffffc0;
      if (lVar29 < (long)uVar22) {
        lVar27 = uVar19 - 1;
        auVar32._8_4_ = (int)lVar27;
        auVar32._0_8_ = lVar27;
        auVar32._12_4_ = (int)((ulong)lVar27 >> 0x20);
        lVar27 = lVar29 * uVar19 * 4 + 0xc + (long)pvVar30;
        auVar32 = auVar32 ^ _DAT_002360d0;
        do {
          if (uVar19 != 0) {
            uVar23 = 0;
            auVar36 = auVar13;
            auVar39 = auVar12;
            do {
              auVar41 = auVar36 ^ auVar14;
              iVar33 = auVar32._4_4_;
              if ((bool)(~(auVar41._4_4_ == iVar33 && auVar32._0_4_ < auVar41._0_4_ ||
                          iVar33 < auVar41._4_4_) & 1)) {
                *(undefined4 *)(lVar27 + -0xc + uVar23 * 4) = 0xff800000;
              }
              if ((auVar41._12_4_ != auVar32._12_4_ || auVar41._8_4_ <= auVar32._8_4_) &&
                  auVar41._12_4_ <= auVar32._12_4_) {
                *(undefined4 *)(lVar27 + -8 + uVar23 * 4) = 0xff800000;
              }
              auVar41 = auVar39 ^ auVar14;
              iVar17 = auVar41._4_4_;
              if (iVar17 <= iVar33 && (iVar17 != iVar33 || auVar41._0_4_ <= auVar32._0_4_)) {
                *(undefined4 *)(lVar27 + -4 + uVar23 * 4) = 0xff800000;
                *(undefined4 *)(lVar27 + uVar23 * 4) = 0xff800000;
              }
              uVar23 = uVar23 + 4;
              lVar38 = auVar36._8_8_;
              auVar36._0_8_ = auVar36._0_8_ + 4;
              auVar36._8_8_ = lVar38 + 4;
              lVar38 = auVar39._8_8_;
              auVar39._0_8_ = auVar39._0_8_ + 4;
              auVar39._8_8_ = lVar38 + 4;
            } while ((uVar19 + 3 & 0x1fffffffc) != uVar23);
          }
          lVar29 = lVar29 + 1;
          lVar27 = lVar27 + uVar19 * 4;
        } while (lVar29 < (long)uVar22);
      }
    }
    auVar14 = _DAT_002360d0;
    auVar13 = _DAT_002360c0;
    auVar12 = _DAT_002360b0;
    if (pvVar25 != (void *)0x0) {
      uVar22 = (ulong)uVar1 + 0x3f & 0x1ffffffc0;
      lVar29 = (long)(int)uVar1;
      if (lVar29 < (long)uVar22) {
        lVar27 = uVar19 - 1;
        auVar41._8_4_ = (int)lVar27;
        auVar41._0_8_ = lVar27;
        auVar41._12_4_ = (int)((ulong)lVar27 >> 0x20);
        lVar27 = (long)pvVar25 + lVar29 * uVar19 * 4 + 0xc;
        auVar41 = auVar41 ^ _DAT_002360d0;
        do {
          if (uVar19 != 0) {
            uVar23 = 0;
            auVar37 = auVar13;
            auVar40 = auVar12;
            do {
              auVar32 = auVar37 ^ auVar14;
              iVar33 = auVar41._4_4_;
              if ((bool)(~(auVar32._4_4_ == iVar33 && auVar41._0_4_ < auVar32._0_4_ ||
                          iVar33 < auVar32._4_4_) & 1)) {
                *(undefined4 *)(lVar27 + -0xc + uVar23 * 4) = 0xff800000;
              }
              if ((auVar32._12_4_ != auVar41._12_4_ || auVar32._8_4_ <= auVar41._8_4_) &&
                  auVar32._12_4_ <= auVar41._12_4_) {
                *(undefined4 *)(lVar27 + -8 + uVar23 * 4) = 0xff800000;
              }
              auVar32 = auVar40 ^ auVar14;
              iVar17 = auVar32._4_4_;
              if (iVar17 <= iVar33 && (iVar17 != iVar33 || auVar32._0_4_ <= auVar41._0_4_)) {
                *(undefined4 *)(lVar27 + -4 + uVar23 * 4) = 0xff800000;
                *(undefined4 *)(lVar27 + uVar23 * 4) = 0xff800000;
              }
              uVar23 = uVar23 + 4;
              lVar38 = auVar37._8_8_;
              auVar37._0_8_ = auVar37._0_8_ + 4;
              auVar37._8_8_ = lVar38 + 4;
              lVar38 = auVar40._8_8_;
              auVar40._0_8_ = auVar40._0_8_ + 4;
              auVar40._8_8_ = lVar38 + 4;
            } while ((uVar19 + 3 & 0x1fffffffc) != uVar23);
          }
          lVar29 = lVar29 + 1;
          lVar27 = lVar27 + uVar19 * 4;
        } while (lVar29 < (long)uVar22);
      }
    }
  }
  return;
}

Assistant:

void llm_graph_input_attn_kv_unified::set_input(const llama_ubatch * ubatch) {
    if (self_kq_mask || self_kq_mask_swa) {
        const int64_t n_kv         = kv_self->n;
        const int64_t n_tokens     = ubatch->n_tokens;
        const int64_t n_seq_tokens = ubatch->n_seq_tokens;
        const int64_t n_seqs       = ubatch->n_seqs;

        float * data     = nullptr;
        float * data_swa = nullptr;

        if (self_kq_mask) {
            GGML_ASSERT(ggml_backend_buffer_is_host(self_kq_mask->buffer));
            data = (float *) self_kq_mask->data;
        }

        if (self_kq_mask_swa) {
            GGML_ASSERT(ggml_backend_buffer_is_host(self_kq_mask_swa->buffer));
            data_swa = (float *) self_kq_mask_swa->data;
        }

        // Use only the previous KV cells of the correct sequence for each token of the ubatch.
        // It's assumed that if a token in the batch has multiple sequences, they are equivalent.
        // Example with a cache of 10 tokens, 2 tokens populated in cache and 3 tokens in batch:
        //   Causal mask:
        //      xxx-------
        //      xxxx------
        //      xxxxx-----
        //   Non-causal mask:
        //      xxxxx-----
        //      xxxxx-----
        //      xxxxx-----
        // To visualize the mask, see https://github.com/ggml-org/llama.cpp/pull/12615
        for (int h = 0; h < 1; ++h) {
            for (int s = 0; s < n_seqs; ++s) {
                const llama_seq_id seq_id = ubatch->seq_id[s][0];

                for (int j = 0; j < n_seq_tokens; ++j) {
                    const llama_pos pos = ubatch->pos[s*n_seq_tokens + j];
                    for (int i = 0; i < n_kv; ++i) {
                        float f;
                        // mask the token if:
                        if (!kv_self->cells[i].has_seq_id(seq_id) // not the correct sequence
                            || (cparams.causal_attn && kv_self->cells[i].pos > pos) // for causal, mask future tokens
                        ) {
                            f = -INFINITY;
                        } else {
                            if (hparams.use_alibi) {
                                f = -std::abs(kv_self->cells[i].pos - pos);
                            } else {
                                f = 0.0f;
                            }
                        }

                        if (data) {
                            data[h*(n_kv*n_tokens) + s*(n_kv*n_seq_tokens) + j*n_kv + i] = f;
                        }

                        // may need to cut off old tokens for sliding window
                        // TODO @ngxson : we are currently re-using the swa logic to store the chunked mask, we should rename SWA to something more generic like "aux mask"
                        if (data_swa) {
                            if (hparams.n_attn_chunk) {
                                llama_pos pos_chunk_start = (pos / hparams.n_attn_chunk) * hparams.n_attn_chunk;
                                if (kv_self->cells[i].pos < pos_chunk_start || pos < pos_chunk_start) {
                                    f = -INFINITY;
                                }
                            } else {
                                if (pos - kv_self->cells[i].pos >= (int32_t)hparams.n_swa) {
                                    f = -INFINITY;
                                }
                            }
                            data_swa[h*(n_kv*n_tokens) + s*(n_kv*n_seq_tokens) + j*n_kv + i] = f;
                        }
                    }
                }
            }

            // mask padded tokens
            if (data) {
                for (int i = n_tokens; i < GGML_PAD(n_tokens, GGML_KQ_MASK_PAD); ++i) {
                    for (int j = 0; j < n_kv; ++j) {
                        data[h*(n_kv*n_tokens) + i*n_kv + j] = -INFINITY;
                    }
                }
            }

            // mask padded tokens
            if (data_swa) {
                for (int i = n_tokens; i < GGML_PAD(n_tokens, GGML_KQ_MASK_PAD); ++i) {
                    for (int j = 0; j < n_kv; ++j) {
                        data_swa[h*(n_kv*n_tokens) + i*n_kv + j] = -INFINITY;
                    }
                }
            }
        }
    }
}